

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::ParseBlocks(DXFImporter *this,LineReader *reader,FileData *output)

{
  bool bVar1;
  LineReader *reader_00;
  Logger *this_00;
  char *local_1c8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  while (reader->end < 2) {
    bVar1 = DXF::LineReader::Is(reader,0,"ENDSEC");
    if (bVar1) break;
    bVar1 = DXF::LineReader::Is(reader,0,"BLOCK");
    reader_00 = DXF::LineReader::operator++(reader);
    if (bVar1) {
      ParseBlock(this,reader_00,output);
    }
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[10]>(&local_1a8,(char (*) [10])"DXF: got ");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::operator<<((ostream *)&local_1a8," entries in BLOCKS");
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_1c8[0]);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void DXFImporter::ParseBlocks(DXF::LineReader& reader, DXF::FileData& output) {
    while( !reader.End() && !reader.Is(0,"ENDSEC")) {
        if (reader.Is(0,"BLOCK")) {
            ParseBlock(++reader,output);
            continue;
        }
        ++reader;
    }

    ASSIMP_LOG_DEBUG_F("DXF: got ", output.blocks.size()," entries in BLOCKS" );
}